

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::writeMPS
          (SPxLPBase<double> *this,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames,
          DIdxSet *p_intvars,bool writeZeroObjective)

{
  double *pdVar1;
  Item *pIVar2;
  Nonzero<double> *pNVar3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  SPxOut *pSVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  undefined8 *puVar9;
  char *name2_00;
  bool bVar10;
  uint uVar11;
  bool bVar12;
  int iVar13;
  char *pcVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  long in_FS_OFFSET;
  bool bVar19;
  Real RVar20;
  double dVar21;
  double dVar22;
  char name1 [16];
  Verbosity old_verbosity;
  char name [16];
  char name2 [16];
  char local_a8 [24];
  ulong local_90;
  ulong local_88;
  undefined4 local_7c;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  char local_58 [16];
  char local_48 [24];
  
  lVar17 = *(long *)p_output;
  *(undefined8 *)(p_output + *(long *)(lVar17 + -0x18) + 8) = 0x10;
  lVar17 = *(long *)(lVar17 + -0x18);
  *(uint *)(p_output + lVar17 + 0x18) = *(uint *)(p_output + lVar17 + 0x18) & 0xfffffefb | 0x100;
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"NAME          MPSDATA",0x15);
  cVar5 = (char)p_output;
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"ROWS",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  if ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum < 1) {
    bVar6 = false;
  }
  else {
    dVar21 = *(double *)(in_FS_OFFSET + -8);
    lVar17 = 0;
    bVar10 = false;
    do {
      dVar22 = (this->super_LPRowSetBase<double>).left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar17];
      pdVar1 = (this->super_LPRowSetBase<double>).right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar17;
      if ((dVar22 != *pdVar1) || (NAN(dVar22) || NAN(*pdVar1))) {
        ::soplex::infinity::__tls_init();
        if (-dVar21 < dVar22) {
          dVar22 = (this->super_LPRowSetBase<double>).right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar17];
          ::soplex::infinity::__tls_init();
          pcVar14 = "E";
          bVar6 = true;
          if (dVar22 < dVar21) goto LAB_001b11aa;
        }
        dVar22 = (this->super_LPRowSetBase<double>).left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar17];
        ::soplex::infinity::__tls_init();
        if (dVar22 <= -dVar21) {
          dVar22 = (this->super_LPRowSetBase<double>).right.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar17];
          ::soplex::infinity::__tls_init();
          pcVar14 = "L";
          bVar6 = bVar10;
          if (dVar21 <= dVar22) {
            puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_78 = local_68;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"XMPSWR02 This should never happen.","");
            *puVar9 = &PTR__SPxException_006a9ee8;
            puVar9[1] = puVar9 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar9 + 1),local_78,local_78 + local_70);
            *puVar9 = &PTR__SPxException_006a9ec0;
            __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
        }
        else {
          pcVar14 = "G";
          bVar6 = bVar10;
        }
      }
      else {
        pcVar14 = "E";
        bVar6 = bVar10;
      }
LAB_001b11aa:
      pcVar8 = MPSgetRowName<double>(this,(int)lVar17,p_rnames,local_58);
      MPSwriteRecord<double>(p_output,pcVar14,pcVar8,(char *)0x0,0.0,(char *)0x0,0.0);
      lVar17 = lVar17 + 1;
      bVar10 = bVar6;
    } while (lVar17 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  MPSwriteRecord<double>(p_output,"N","MINIMIZE",(char *)0x0,0.0,(char *)0x0,0.0);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"COLUMNS",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  if (p_intvars == (DIdxSet *)0x0) {
    bVar10 = false;
  }
  else {
    bVar10 = 0 < (p_intvars->super_IdxSet).num;
  }
  uVar15 = 0;
  do {
    bVar12 = (bool)((int)uVar15 == 1 & bVar10);
    local_90 = uVar15;
    if (bVar12 == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                (p_output,"    MARK0001  \'MARKER\'                 \'INTORG\'",0x2f);
      std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
    }
    if (0 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
      lVar17 = 0;
      do {
        iVar13 = (int)lVar17;
        if (bVar10 == false) {
          bVar19 = false;
        }
        else {
          iVar7 = IdxSet::pos(&p_intvars->super_IdxSet,iVar13);
          bVar19 = -1 < iVar7;
        }
        if (bVar12 == bVar19) {
          pIVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                   (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar17].idx
          ;
          iVar7 = (pIVar2->data).super_SVectorBase<double>.memused;
          uVar11 = iVar7 - (iVar7 >> 0x1f) & 0xfffffffe;
          if (iVar7 < 2) {
            uVar15 = 0;
          }
          else {
            local_88 = (ulong)uVar11;
            lVar18 = 0;
            uVar15 = 0;
            do {
              pcVar14 = getColName<double>(this,iVar13,p_cnames,local_58);
              pcVar8 = MPSgetRowName<double>
                                 (this,*(int *)((long)&((pIVar2->data).super_SVectorBase<double>.
                                                       m_elem)->idx + lVar18),p_rnames,local_a8);
              pNVar3 = (pIVar2->data).super_SVectorBase<double>.m_elem;
              dVar21 = *(double *)((long)&pNVar3->val + lVar18);
              name2_00 = MPSgetRowName<double>
                                   (this,*(int *)((long)&pNVar3[1].idx + lVar18),p_rnames,local_48);
              MPSwriteRecord<double>
                        (p_output,(char *)0x0,pcVar14,pcVar8,dVar21,name2_00,
                         *(double *)
                          ((long)&(pIVar2->data).super_SVectorBase<double>.m_elem[1].val + lVar18));
              uVar15 = uVar15 + 2;
              lVar18 = lVar18 + 0x20;
            } while (uVar15 < local_88);
          }
          if (uVar11 != (pIVar2->data).super_SVectorBase<double>.memused) {
            pcVar14 = getColName<double>(this,iVar13,p_cnames,local_58);
            pcVar8 = MPSgetRowName<double>
                               (this,(pIVar2->data).super_SVectorBase<double>.m_elem[uVar15].idx,
                                p_rnames,local_a8);
            MPSwriteRecord<double>
                      (p_output,(char *)0x0,pcVar14,pcVar8,
                       (pIVar2->data).super_SVectorBase<double>.m_elem[uVar15].val,(char *)0x0,0.0);
          }
          this_00 = (this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          dVar21 = (this->super_LPColSetBase<double>).object.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar17];
          this_01 = (this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          RVar20 = Tolerances::epsilon(this_00);
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          if (RVar20 < ABS(dVar21) || writeZeroObjective) {
            pcVar14 = getColName<double>(this,iVar13,p_cnames,local_58);
            MPSwriteRecord<double>
                      (p_output,(char *)0x0,pcVar14,"MINIMIZE",
                       -(this->super_LPColSetBase<double>).object.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar17],(char *)0x0,0.0);
          }
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
    }
    if (bVar12 != false) {
      std::__ostream_insert<char,std::char_traits<char>>
                (p_output,"    MARK0001  \'MARKER\'                 \'INTEND\'",0x2f);
      std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
    }
    uVar15 = (ulong)((int)local_90 + 1);
  } while ((bool)(bVar10 & (int)local_90 == 0));
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"RHS",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  if (0 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
    uVar15 = 0;
    do {
      if ((int)uVar15 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
        uVar15 = (ulong)(int)uVar15;
        do {
          dVar21 = MPSgetRHS<double>((this->super_LPRowSetBase<double>).left.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar15],
                                     (this->super_LPRowSetBase<double>).right.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[uVar15]);
          if ((dVar21 != 0.0) || (NAN(dVar21))) break;
          uVar15 = uVar15 + 1;
        } while ((long)uVar15 <
                 (long)(this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
      }
      else {
        dVar21 = 0.0;
      }
      uVar11 = (uint)uVar15;
      if ((int)uVar11 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
        iVar13 = uVar11 + 1;
        dVar22 = 0.0;
        uVar16 = uVar11;
        if (iVar13 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
          lVar17 = (long)(int)uVar11;
          dVar22 = MPSgetRHS<double>((this->super_LPRowSetBase<double>).left.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar17 + 1],
                                     (this->super_LPRowSetBase<double>).right.val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar17 + 1]);
          if ((dVar22 != 0.0) || (NAN(dVar22))) {
            lVar17 = lVar17 + 1;
          }
          else {
            uVar15 = uVar15 & 0xffffffff;
            lVar18 = lVar17 + 2;
            while (lVar17 = lVar18,
                  lVar17 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
              dVar22 = MPSgetRHS<double>((this->super_LPRowSetBase<double>).left.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[lVar17],
                                         (this->super_LPRowSetBase<double>).right.val.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[lVar17]);
              uVar16 = (int)uVar15 + 1;
              uVar15 = (ulong)uVar16;
              if ((dVar22 != 0.0) || (lVar18 = lVar17 + 1, NAN(dVar22))) goto LAB_001b185c;
            }
            uVar16 = (int)uVar15 + 1;
          }
LAB_001b185c:
          iVar13 = (int)lVar17;
        }
        iVar7 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        pcVar14 = MPSgetRowName<double>(this,uVar11,p_rnames,local_a8);
        if (iVar13 < iVar7) {
          pcVar8 = MPSgetRowName<double>(this,iVar13,p_rnames,local_48);
        }
        else {
          dVar22 = 0.0;
          pcVar8 = (char *)0x0;
        }
        MPSwriteRecord<double>(p_output,(char *)0x0,"RHS",pcVar14,dVar21,pcVar8,dVar22);
        uVar15 = (ulong)(uVar16 + 2);
      }
    } while ((int)uVar15 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>(p_output,"RANGES",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
    if (0 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum) {
      dVar21 = *(double *)(in_FS_OFFSET + -8);
      lVar17 = 0;
      do {
        dVar22 = (this->super_LPRowSetBase<double>).left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar17];
        ::soplex::infinity::__tls_init();
        if ((-dVar21 < dVar22) &&
           (dVar22 = (this->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar17], ::soplex::infinity::__tls_init(),
           dVar22 < dVar21)) {
          pcVar14 = MPSgetRowName<double>(this,(int)lVar17,p_rnames,local_a8);
          MPSwriteRecord<double>
                    (p_output,"","RANGE",pcVar14,
                     (this->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar17] -
                     (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar17],(char *)0x0,0.0);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"BOUNDS",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  if (0 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
    dVar21 = *(double *)(in_FS_OFFSET + -8);
    lVar17 = 0;
    do {
      dVar22 = (this->super_LPColSetBase<double>).low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar17];
      pdVar1 = (this->super_LPColSetBase<double>).up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar17;
      iVar13 = (int)lVar17;
      if ((dVar22 != *pdVar1) || (NAN(dVar22) || NAN(*pdVar1))) {
        ::soplex::infinity::__tls_init();
        if ((dVar22 <= -dVar21) &&
           (dVar22 = (this->super_LPColSetBase<double>).up.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar17], ::soplex::infinity::__tls_init(),
           dVar21 <= dVar22)) {
          pcVar14 = getColName<double>(this,iVar13,p_cnames,local_a8);
          dVar22 = 0.0;
          pcVar8 = "FR";
          goto LAB_001b1ceb;
        }
        dVar22 = (this->super_LPColSetBase<double>).low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar17];
        if ((dVar22 != 0.0) || (NAN(dVar22))) {
          ::soplex::infinity::__tls_init();
          pcVar14 = getColName<double>(this,iVar13,p_cnames,local_a8);
          if (dVar22 <= -dVar21) {
            dVar22 = 0.0;
            pcVar8 = "MI";
          }
          else {
            dVar22 = (this->super_LPColSetBase<double>).low.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar17];
            pcVar8 = "LO";
          }
          MPSwriteRecord<double>(p_output,pcVar8,"BOUND",pcVar14,dVar22,(char *)0x0,0.0);
        }
        if (((bVar10 != false) && (iVar7 = IdxSet::pos(&p_intvars->super_IdxSet,iVar13), -1 < iVar7)
            ) || (dVar22 = (this->super_LPColSetBase<double>).up.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar17],
                 ::soplex::infinity::__tls_init(), dVar22 < dVar21)) {
          pcVar14 = getColName<double>(this,iVar13,p_cnames,local_a8);
          dVar22 = (this->super_LPColSetBase<double>).up.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar17];
          pcVar8 = "UP";
          goto LAB_001b1ceb;
        }
      }
      else {
        pcVar14 = getColName<double>(this,iVar13,p_cnames,local_a8);
        dVar22 = (this->super_LPColSetBase<double>).low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar17];
        pcVar8 = "FX";
LAB_001b1ceb:
        MPSwriteRecord<double>(p_output,pcVar8,"BOUND",pcVar14,dVar22,(char *)0x0,0.0);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"ENDATA",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)p_output + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  if (((this->thesense == MAXIMIZE) && (pSVar4 = this->spxout, pSVar4 != (SPxOut *)0x0)) &&
     (0 < (int)pSVar4->m_verbosity)) {
    local_78 = (undefined1 *)CONCAT44(local_78._4_4_,pSVar4->m_verbosity);
    local_7c = 1;
    (*pSVar4->_vptr_SPxOut[2])();
    std::__ostream_insert<char,std::char_traits<char>>
              (this->spxout->m_streams[this->spxout->m_verbosity],
               "XMPSWR03 Warning: objective function inverted when writing maximization problem in MPS file format\n"
               ,99);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_78);
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::writeMPS(
   std::ostream&  p_output,          ///< output stream.
   const NameSet* p_rnames,          ///< row names.
   const NameSet* p_cnames,          ///< column names.
   const DIdxSet* p_intvars,         ///< integer variables.
   const bool     writeZeroObjective ///< write zero objective coefficients
) const
{

   const char*    indicator;
   char           name [16];
   char           name1[16];
   char           name2[16];
   bool           has_ranges = false;
   int            i;
   int            k;

   SPxOut::setScientific(p_output, 16);
   // --- NAME Section ---
   p_output << "NAME          MPSDATA" << std::endl;

   // --- ROWS Section ---
   p_output << "ROWS" << std::endl;

   for(i = 0; i < nRows(); i++)
   {
      if(lhs(i) == rhs(i))
         indicator = "E";
      else if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
      {
         indicator = "E";
         has_ranges = true;
      }
      else if(lhs(i) > R(-infinity))
         indicator = "G";
      else if(rhs(i) <  R(infinity))
         indicator = "L";
      else
         throw SPxInternalCodeException("XMPSWR02 This should never happen.");

      MPSwriteRecord<R>(p_output, indicator, MPSgetRowName(*this, i, p_rnames, name));
   }

   MPSwriteRecord<R>(p_output, "N", "MINIMIZE");

   // --- COLUMNS Section ---
   p_output << "COLUMNS" << std::endl;

   bool has_intvars = (p_intvars != nullptr) && (p_intvars->size() > 0);

   for(int j = 0; j < (has_intvars ? 2 : 1); j++)
   {
      bool is_intrun = has_intvars && (j == 1);

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTORG'" << std::endl;

      for(i = 0; i < nCols(); i++)
      {
         bool is_intvar = has_intvars && (p_intvars->pos(i) >= 0);

         if((is_intrun && !is_intvar) || (!is_intrun &&  is_intvar))
            continue;

         const SVectorBase<R>& col = colVector(i);
         int colsize2 = (col.size() / 2) * 2;

         assert(colsize2 % 2 == 0);

         for(k = 0; k < colsize2; k += 2)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k),
                           MPSgetRowName(*this, col.index(k + 1), p_rnames, name2), col.value(k + 1));

         if(colsize2 != col.size())
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k));

         if(isNotZero(maxObj(i), this->tolerances()->epsilon()) || writeZeroObjective)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name), "MINIMIZE", -maxObj(i));
      }

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTEND'" << std::endl;
   }

   // --- RHS Section ---
   p_output << "RHS" << std::endl;

   i = 0;

   while(i < nRows())
   {
      R rhsval1 = 0.0;
      R rhsval2 = 0.0;

      for(; i < nRows(); i++)
         if((rhsval1 = MPSgetRHS(lhs(i), rhs(i))) != 0.0)
            break;

      if(i < nRows())
      {
         for(k = i + 1; k < nRows(); k++)
         {
            if((rhsval2 = MPSgetRHS(lhs(k), rhs(k))) != 0.0)
               break;
         }

         if(k < nRows())
         {
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1,
                           MPSgetRowName(*this, k, p_rnames, name2), rhsval2);
         }
         else
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1);

         i = k + 1;
      }
   }

   // --- RANGES Section ---
   if(has_ranges)
   {
      p_output << "RANGES" << std::endl;

      for(i = 0; i < nRows(); i++)
      {
         if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
            MPSwriteRecord(p_output, "", "RANGE", MPSgetRowName(*this, i, p_rnames, name1), rhs(i) - lhs(i));
      }
   }

   // --- BOUNDS Section ---
   p_output << "BOUNDS" << std::endl;

   for(i = 0; i < nCols(); i++)
   {
      if(lower(i) == upper(i))
      {
         MPSwriteRecord(p_output, "FX", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         continue;
      }

      if((lower(i) <= R(-infinity)) && (upper(i) >= R(infinity)))
      {
         MPSwriteRecord<R>(p_output, "FR", "BOUND", getColName(*this, i, p_cnames, name1));
         continue;
      }

      if(lower(i) != 0.0)
      {
         if(lower(i) > R(-infinity))
            MPSwriteRecord(p_output, "LO", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         else
            MPSwriteRecord<R>(p_output, "MI", "BOUND", getColName(*this, i, p_cnames, name1));
      }

      if(has_intvars && (p_intvars->pos(i) >= 0))
      {
         // Integer variables have default upper bound 1.0, but we should write
         // it nevertheless since CPLEX seems to assume R(infinity) otherwise.
         MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
      else
      {
         // Continous variables have default upper bound R(infinity)
         if(upper(i) < R(infinity))
            MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
   }

   // --- ENDATA Section ---
   p_output << "ENDATA" << std::endl;

   // Output warning when writing a maximisation problem
   if(spxSense() == SPxLPBase<R>::MAXIMIZE)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "XMPSWR03 Warning: objective function inverted when writing maximization problem in MPS file format\n");
   }
}